

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

void __thiscall cppcms::crypto::openssl_aes_encryptor::check(openssl_aes_encryptor *this)

{
  size_t sVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  long in_RDI;
  string *in_stack_ffffffffffffff78;
  string *s;
  runtime_error *in_stack_ffffffffffffff80;
  undefined1 local_61 [36];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  sVar1 = crypto::key::size((key *)(in_RDI + 8));
  if (sVar1 == 0) {
    local_3d = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,"cppcms::crypto::aes: attempt to use cbc without key",&local_29);
    booster::runtime_error::runtime_error(this_00,in_stack_ffffffffffffff78);
    local_3d = 0;
    __cxa_throw(this_00,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  if ((*(byte *)(in_RDI + 0x226) & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x30);
    s = (string *)local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_61 + 1),
               "cppcms::crypto::aes: attempt to use cbc without initial vector set",(allocator *)s);
    booster::runtime_error::runtime_error(in_stack_ffffffffffffff80,s);
    __cxa_throw(uVar2,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void check()
		{
			if(key_.size() == 0)
				throw booster::runtime_error("cppcms::crypto::aes: attempt to use cbc without key");
			if(!iv_initialized_)
				throw booster::runtime_error("cppcms::crypto::aes: attempt to use cbc without initial vector set");
		}